

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptesttest.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  HelloWorld greeter;
  allocator<char> local_49;
  HelloWorld local_48 [32];
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_28,"Hello World!",&local_49);
  HelloWorld::HelloWorld(local_48,local_28);
  std::__cxx11::string::~string(local_28);
  HelloWorld::Print();
  std::__cxx11::string::string<std::allocator<char>>(local_28," Have a good one!",&local_49);
  HelloWorld::Append((string *)local_48);
  std::__cxx11::string::~string(local_28);
  HelloWorld::Print();
  poVar1 = std::operator<<((ostream *)&std::cout,"The message: ");
  poVar1 = std::operator<<(poVar1,(string *)local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  HelloWorld::Reverse();
  HelloWorld::Print();
  std::__cxx11::string::~string((string *)local_48);
  return 0;
}

Assistant:

int main()
{
    HelloWorld greeter("Hello World!");
    greeter.Print();
    greeter.Append(" Have a good one!");
    greeter.Print();
    std::cout << "The message: " << greeter.GetMessage() << std::endl;
    greeter.Reverse();
    greeter.Print();
}